

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

string * __thiscall CLI::App::help(string *__return_storage_ptr__,App *this,size_t wid,string *prev)

{
  _Rb_tree_node_base *__rhs;
  App *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  reference ppAVar8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  size_type sVar11;
  pointer puVar12;
  char *pcVar13;
  byte bVar14;
  pointer puVar15;
  Option_p *opt;
  pointer puVar16;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  string local_3a0;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  stringstream out;
  ostream local_1c8 [376];
  string local_50;
  
  if (prev->_M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)prev);
  }
  else {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out," ",
                     &this->name_);
    ::std::__cxx11::string::append((string *)prev);
    ::std::__cxx11::string::~string((string *)&out);
  }
  get_subcommands(&selected_subcommands,this,true);
  if (selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
    poVar9 = ::std::operator<<(local_1c8,(string *)&this->description_);
    ::std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = ::std::operator<<(local_1c8,"Usage: ");
    ::std::operator<<(poVar9,(string *)prev);
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &groups._M_t._M_impl.super__Rb_tree_header._M_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    puVar1 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = false;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (puVar15 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1;
        puVar15 = puVar15 + 1) {
      bVar5 = Option::nonpositional
                        ((puVar15->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (bVar5) {
        bVar6 = true;
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&groups,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (puVar15->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
    }
    if (bVar6) {
      ::std::operator<<(local_1c8," [OPTIONS]");
    }
    puVar1 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar14 = 0;
    for (puVar15 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1;
        puVar15 = puVar15 + 1) {
      if ((((puVar15->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->pname_)._M_string_length != 0
         ) {
        poVar9 = ::std::operator<<(local_1c8," ");
        Option::help_positional_abi_cxx11_
                  ((string *)&subcmd_groups_seen,
                   (puVar15->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        ::std::operator<<(poVar9,(string *)&subcmd_groups_seen);
        ::std::__cxx11::string::~string((string *)&subcmd_groups_seen);
        bVar5 = Option::_has_help_positional
                          ((puVar15->_M_t).
                           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        bVar14 = bVar14 | bVar5;
      }
    }
    if ((this->subcommands_).
        super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->subcommands_).
        super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar13 = " SUBCOMMAND";
      if (this->require_subcommand_min_ == 0) {
        pcVar13 = " [SUBCOMMAND]";
      }
      ::std::operator<<(local_1c8,pcVar13);
    }
    ::std::endl<char,std::char_traits<char>>(local_1c8);
    if (bVar14 != 0) {
      poVar9 = ::std::endl<char,std::char_traits<char>>(local_1c8);
      poVar9 = ::std::operator<<(poVar9,"Positionals:");
      ::std::endl<char,std::char_traits<char>>(poVar9);
      puVar1 = (this->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar15 = (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1;
          puVar15 = puVar15 + 1) {
        ::std::__cxx11::string::string
                  ((string *)&local_1f8,
                   (string *)
                   (puVar15->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        detail::to_lower((string *)&subcmd_groups_seen,&local_1f8);
        lVar4 = CONCAT44(subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                         subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        ::std::__cxx11::string::~string((string *)&subcmd_groups_seen);
        ::std::__cxx11::string::~string((string *)&local_1f8);
        if (lVar4 != 0) {
          bVar5 = Option::_has_help_positional
                            ((puVar15->_M_t).
                             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                             .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          if (bVar5) {
            Option::help_pname_abi_cxx11_
                      (&local_218,
                       (puVar15->_M_t).
                       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
            ::std::__cxx11::string::string
                      ((string *)&local_238,
                       (string *)
                       &((puVar15->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->description_);
            detail::format_help(&out,&local_218,&local_238,wid);
            ::std::__cxx11::string::~string((string *)&local_238);
            ::std::__cxx11::string::~string((string *)&local_218);
          }
        }
      }
    }
    if (bVar6) {
      for (p_Var10 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &groups._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10)) {
        __rhs = p_Var10 + 1;
        ::std::__cxx11::string::string((string *)&local_2d8,(string *)__rhs);
        detail::to_lower((string *)&subcmd_groups_seen,&local_2d8);
        lVar4 = CONCAT44(subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                         subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        ::std::__cxx11::string::~string((string *)&subcmd_groups_seen);
        ::std::__cxx11::string::~string((string *)&local_2d8);
        if (lVar4 != 0) {
          poVar9 = ::std::endl<char,std::char_traits<char>>(local_1c8);
          poVar9 = ::std::operator<<(poVar9,(string *)__rhs);
          poVar9 = ::std::operator<<(poVar9,":");
          ::std::endl<char,std::char_traits<char>>(poVar9);
          puVar1 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar15 = (this->options_).
                         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1;
              puVar15 = puVar15 + 1) {
            bVar6 = Option::nonpositional
                              ((puVar15->_M_t).
                               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                               .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
            if (bVar6) {
              _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(puVar15->_M_t).
                                           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                           .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl
                                        ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)__rhs);
              if (_Var7) {
                Option::help_name_abi_cxx11_
                          (&local_258,
                           (puVar15->_M_t).
                           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,true);
                ::std::__cxx11::string::string
                          ((string *)&local_278,
                           (string *)
                           &((puVar15->_M_t).
                             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                             .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->
                            description_);
                detail::format_help(&out,&local_258,&local_278,wid);
                ::std::__cxx11::string::~string((string *)&local_278);
                ::std::__cxx11::string::~string((string *)&local_258);
              }
            }
          }
        }
      }
    }
    puVar16 = (this->subcommands_).
              super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar2) {
      subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header;
      subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (; puVar16 != puVar2; puVar16 = puVar16 + 1) {
        ::std::__cxx11::string::string
                  ((string *)&local_2f8,
                   (string *)
                   &((puVar16->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>
                     ._M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                     super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->group_);
        detail::to_lower(&local_3a0,&local_2f8);
        ::std::__cxx11::string::~string((string *)&local_2f8);
        if (local_3a0._M_string_length != 0) {
          sVar11 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::count(&subcmd_groups_seen,&local_3a0);
          if (sVar11 == 0) {
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&subcmd_groups_seen,&local_3a0);
            poVar9 = ::std::endl<char,std::char_traits<char>>(local_1c8);
            poVar9 = ::std::operator<<(poVar9,(string *)
                                              &((puVar16->_M_t).
                                                super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>
                                                .super__Head_base<0UL,_CLI::App_*,_false>.
                                               _M_head_impl)->group_);
            poVar9 = ::std::operator<<(poVar9,":");
            ::std::endl<char,std::char_traits<char>>(poVar9);
            puVar3 = (this->subcommands_).
                     super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar12 = (this->subcommands_).
                           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3;
                puVar12 = puVar12 + 1) {
              ::std::__cxx11::string::string
                        ((string *)&local_298,
                         (string *)
                         &((puVar12->_M_t).
                           super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                           super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                           super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->group_);
              detail::to_lower(&local_50,&local_298);
              _Var7 = ::std::operator==(&local_50,&local_3a0);
              ::std::__cxx11::string::~string((string *)&local_50);
              ::std::__cxx11::string::~string((string *)&local_298);
              if (_Var7) {
                ::std::__cxx11::string::string
                          ((string *)&local_318,
                           (string *)
                           &((puVar12->_M_t).
                             super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->name_);
                ::std::__cxx11::string::string
                          ((string *)&local_2b8,
                           (string *)
                           &((puVar12->_M_t).
                             super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->description_);
                detail::format_help(&out,&local_318,&local_2b8,wid);
                ::std::__cxx11::string::~string((string *)&local_2b8);
                ::std::__cxx11::string::~string((string *)&local_318);
              }
            }
          }
        }
        ::std::__cxx11::string::~string((string *)&local_3a0);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&subcmd_groups_seen._M_t);
    }
    if ((this->footer_)._M_string_length != 0) {
      poVar9 = ::std::endl<char,std::char_traits<char>>(local_1c8);
      poVar9 = ::std::operator<<(poVar9,(string *)&this->footer_);
      ::std::endl<char,std::char_traits<char>>(poVar9);
    }
    ::std::__cxx11::stringbuf::str();
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&groups._M_t);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  else {
    ppAVar8 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at(&selected_subcommands,0);
    this_00 = *ppAVar8;
    ::std::__cxx11::string::string((string *)&local_338,(string *)prev);
    help(__return_storage_ptr__,this_00,wid,&local_338);
    ::std::__cxx11::string::~string((string *)&local_338);
  }
  std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base
            (&selected_subcommands.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string help(size_t wid = 30, std::string prev = "") const {
        // Delegate to subcommand if needed
        if(prev.empty())
            prev = name_;
        else
            prev += " " + name_;

        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty())
            return selected_subcommands.at(0)->help(wid, prev);

        std::stringstream out;
        out << description_ << std::endl;
        out << "Usage: " << prev;

        // Check for options_
        bool npos = false;
        std::set<std::string> groups;
        for(const Option_p &opt : options_) {
            if(opt->nonpositional()) {
                npos = true;
                groups.insert(opt->get_group());
            }
        }

        if(npos)
            out << " [OPTIONS]";

        // Positionals
        bool pos = false;
        for(const Option_p &opt : options_)
            if(opt->get_positional()) {
                // A hidden positional should still show up in the usage statement
                // if(detail::to_lower(opt->get_group()).empty())
                //    continue;
                out << " " << opt->help_positional();
                if(opt->_has_help_positional())
                    pos = true;
            }

        if(!subcommands_.empty()) {
            if(require_subcommand_min_ > 0)
                out << " SUBCOMMAND";
            else
                out << " [SUBCOMMAND]";
        }

        out << std::endl;

        // Positional descriptions
        if(pos) {
            out << std::endl << "Positionals:" << std::endl;
            for(const Option_p &opt : options_) {
                if(detail::to_lower(opt->get_group()).empty())
                    continue; // Hidden
                if(opt->_has_help_positional())
                    detail::format_help(out, opt->help_pname(), opt->get_description(), wid);
            }
        }

        // Options
        if(npos) {
            for(const std::string &group : groups) {
                if(detail::to_lower(group).empty())
                    continue; // Hidden
                out << std::endl << group << ":" << std::endl;
                for(const Option_p &opt : options_) {
                    if(opt->nonpositional() && opt->get_group() == group)
                        detail::format_help(out, opt->help_name(true), opt->get_description(), wid);
                }
            }
        }

        // Subcommands
        if(!subcommands_.empty()) {
            std::set<std::string> subcmd_groups_seen;
            for(const App_p &com : subcommands_) {
                const std::string &group_key = detail::to_lower(com->get_group());
                if(group_key.empty() || subcmd_groups_seen.count(group_key) != 0)
                    continue; // Hidden or not in a group

                subcmd_groups_seen.insert(group_key);
                out << std::endl << com->get_group() << ":" << std::endl;
                for(const App_p &new_com : subcommands_)
                    if(detail::to_lower(new_com->get_group()) == group_key)
                        detail::format_help(out, new_com->get_name(), new_com->description_, wid);
            }
        }

        if(!footer_.empty()) {
            out << std::endl << footer_ << std::endl;
        }

        return out.str();
    }